

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_section.hpp
# Opt level: O0

ostream_base * __thiscall
pstore::exchange::export_ns::details::section_content_exporter<pstore::repo::linked_definitions>::
operator()(section_content_exporter<pstore::repo::linked_definitions> *this,ostream_base *os,
          indent ind,database *param_3,string_mapping *param_4,linked_definitions *content,
          bool param_6)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  ostream_base *poVar3;
  bool param_6_local;
  linked_definitions *content_local;
  string_mapping *param_4_local;
  database *param_3_local;
  ostream_base *os_local;
  section_content_exporter<pstore::repo::linked_definitions> *this_local;
  indent ind_local;
  
  pvVar1 = std::begin<pstore::repo::linked_definitions>(content);
  pvVar2 = std::end<pstore::repo::linked_definitions>(content);
  poVar3 = export_ns::operator()(os,ind.distance_,pvVar1,pvVar2);
  return poVar3;
}

Assistant:

OStream &
                    operator() (OStream & os, indent const ind, class database const & /*db*/,
                                string_mapping const & /*strings*/,
                                repo::linked_definitions const & content, bool const /*comments*/) {
                        return emit_array (os, ind, std::begin (content), std::end (content),
                                           [] (OStream & os1, indent const ind1,
                                               repo::linked_definitions::value_type const & d) {
                                               os1 << ind1 << '{' << R"("compilation":)";
                                               emit_digest (os1, d.compilation);
                                               os1 << R"(,"index":)" << d.index << '}';
                                           });
                    }